

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall QWidgetPrivate::createTLExtra(QWidgetPrivate *this)

{
  QWExtra *pQVar1;
  __uniq_ptr_data<QTLWExtra,_std::default_delete<QTLWExtra>,_true,_true> _Var2;
  int *piVar3;
  pointer __p_00;
  pointer __p;
  long in_FS_OFFSET;
  __uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_> local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
      super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
      super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl == (QWExtra *)0x0) {
    createExtra(this);
  }
  pQVar1 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  if ((_Head_base<0UL,_QTLWExtra_*,_false>)
      *(_Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_> *)
       &(pQVar1->topextra)._M_t.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_> ==
      (QTLWExtra *)0x0) {
    __p_00 = (pointer)operator_new(0xe8);
    memset(__p_00,0,0xe8);
    (__p_00->frameStrut).x2 = -1;
    (__p_00->frameStrut).y2 = -1;
    (__p_00->normalGeometry).x1 = 0;
    (__p_00->normalGeometry).y1 = 0;
    (__p_00->normalGeometry).x2 = -1;
    (__p_00->normalGeometry).y2 = -1;
    (__p_00->savedFlags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
    super_QFlagsStorage<Qt::WindowType>.i = 0;
    (__p_00->initialScreen).wp.d = (Data *)0x0;
    (__p_00->initialScreen).wp.value = (QObject *)0x0;
    (__p_00->widgetTextures).
    super__Vector_base<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>,_std::allocator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__p_00->widgetTextures).
    super__Vector_base<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>,_std::allocator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__p_00->widgetTextures).
    super__Vector_base<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>,_std::allocator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_38._M_t.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
    super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl =
         (tuple<QTLWExtra_*,_std::default_delete<QTLWExtra>_>)
         (_Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>)0x0;
    std::__uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>::reset
              ((__uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_> *)&pQVar1->topextra,
               __p_00);
    std::unique_ptr<QTLWExtra,_std::default_delete<QTLWExtra>_>::~unique_ptr
              ((unique_ptr<QTLWExtra,_std::default_delete<QTLWExtra>_> *)&local_38);
    _Var2.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
    super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
    super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl =
         (((this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
         super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>;
    *(undefined8 *)
     ((long)_Var2.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
            super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
            super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0x10) = 0;
    *(undefined8 *)
     ((long)_Var2.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
            super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
            super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0x18) = 0;
    *(undefined8 *)
     ((long)_Var2.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
            super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
            super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0x88) = 0;
    *(undefined8 *)
     ((long)_Var2.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
            super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
            super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0x90) = 0;
    *(undefined8 *)
     ((long)_Var2.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
            super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
            super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0x98) = 0;
    *(undefined8 *)
     ((long)_Var2.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
            super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
            super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xa0) = 0;
    *(undefined8 *)
     ((long)_Var2.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
            super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
            super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xa8) = 0xfffffffefffffffe;
    *(undefined4 *)
     ((long)_Var2.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
            super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
            super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xb0) = 0;
    *(ushort *)
     ((long)_Var2.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
            super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
            super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xe0) =
         (ushort)*(undefined4 *)
                  ((long)_Var2.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>.
                         _M_t.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                         super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xe0) & 0xf000 |
         0xff;
    *(undefined8 *)
     ((long)_Var2.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
            super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
            super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0x20) = 0;
    piVar3 = *(int **)((long)_Var2.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                             super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xb8);
    *(undefined8 *)
     ((long)_Var2.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
            super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
            super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xb8) = 0;
    *(undefined8 *)
     ((long)_Var2.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
            super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
            super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xc0) = 0;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        operator_delete(piVar3);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::createTLExtra()
{
    if (!extra)
        createExtra();
    if (!extra->topextra) {
        extra->topextra = std::make_unique<QTLWExtra>();
        QTLWExtra* x = extra->topextra.get();
        x->backingStore = nullptr;
        x->sharedPainter = nullptr;
        x->incw = x->inch = 0;
        x->basew = x->baseh = 0;
        x->frameStrut.setCoords(0, 0, 0, 0);
        x->normalGeometry = QRect(0,0,-1,-1);
        x->savedFlags = { };
        x->opacity = 255;
        x->posIncludesFrame = 0;
        x->sizeAdjusted = false;
        x->embedded = 0;
        x->explicitContentsMarginsRespectsSafeArea = 0;
        x->window = nullptr;
        x->initialScreen = nullptr;

#ifdef QWIDGET_EXTRA_DEBUG
        static int count = 0;
        qDebug() << "tlextra" << ++count;
#endif
    }
}